

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kirkwood.cpp
# Opt level: O0

void __thiscall OpenMD::Kirkwood::collectHistogram(Kirkwood *this,StuntDouble *sd1,StuntDouble *sd2)

{
  bool bVar1;
  uint uVar2;
  reference pvVar3;
  Atom *in_RDX;
  Atom *in_RSI;
  Vector<double,_3U> *in_RDI;
  uint i;
  int whichBin;
  RealType dotProduct;
  Vector3d d2;
  Vector3d d1;
  MultipoleAdapter ma2;
  MultipoleAdapter ma1;
  AtomType *atype2;
  AtomType *atype1;
  RealType distance;
  Vector3d r12;
  Vector3d pos2;
  Vector3d pos1;
  bool usePeriodicBoundaryConditions_;
  Vector<double,_3U> *in_stack_fffffffffffffe98;
  double dVar4;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  Vector<double,_3U> *in_stack_fffffffffffffeb0;
  double local_120;
  double local_118;
  Vector<double,_3U> local_110;
  MultipoleAdapter *in_stack_ffffffffffffff08;
  Vector3d *in_stack_ffffffffffffff18;
  Snapshot *in_stack_ffffffffffffff20;
  Vector<double,_3U> local_d8 [2];
  MultipoleAdapter local_a8;
  MultipoleAdapter local_a0;
  AtomType *local_98;
  AtomType *local_90;
  double local_88;
  byte local_19;
  Atom *local_18;
  Atom *local_10;
  
  if (in_RSI != in_RDX) {
    local_18 = in_RDX;
    local_10 = in_RSI;
    SimInfo::getSimParams((SimInfo *)in_RDI->data_[1]);
    local_19 = Globals::getUsePeriodicBoundaryConditions((Globals *)0x1712e9);
    StuntDouble::getPos((StuntDouble *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)
                       );
    StuntDouble::getPos((StuntDouble *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)
                       );
    OpenMD::operator-((Vector<double,_3U> *)
                      CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),in_RDI);
    Vector3<double>::Vector3((Vector3<double> *)in_RDI,in_stack_fffffffffffffe98);
    if ((local_19 & 1) != 0) {
      Snapshot::wrapVector(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    }
    local_88 = Vector<double,_3U>::length((Vector<double,_3U> *)0x17137e);
    local_90 = Atom::getAtomType(local_10);
    local_98 = Atom::getAtomType(local_18);
    MultipoleAdapter::MultipoleAdapter(&local_a0,local_90);
    MultipoleAdapter::MultipoleAdapter(&local_a8,local_98);
    Vector<double,_3U>::Vector(local_d8,(double *)&stack0xffffffffffffff20);
    Vector3<double>::Vector3((Vector3<double> *)in_RDI,in_stack_fffffffffffffe98);
    local_118 = 0.0;
    Vector<double,_3U>::Vector(&local_110,&local_118);
    Vector3<double>::Vector3((Vector3<double> *)in_RDI,in_stack_fffffffffffffe98);
    local_120 = 0.0;
    bVar1 = MultipoleAdapter::isDipole(in_stack_ffffffffffffff08);
    if (bVar1) {
      StuntDouble::getDipole
                ((StuntDouble *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      Vector3<double>::operator=
                ((Vector3<double> *)in_RDI,(Vector3<double> *)in_stack_fffffffffffffe98);
      Vector<double,_3U>::normalize(in_RDI);
      bVar1 = MultipoleAdapter::isDipole(in_stack_ffffffffffffff08);
      if (bVar1) {
        StuntDouble::getDipole
                  ((StuntDouble *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        Vector3<double>::operator=
                  ((Vector3<double> *)in_RDI,(Vector3<double> *)in_stack_fffffffffffffe98);
        Vector<double,_3U>::normalize(in_RDI);
        local_120 = dot<double,3u>(in_stack_fffffffffffffeb0,
                                   (Vector<double,_3U> *)
                                   CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      }
    }
    if (local_88 < in_RDI[0xa7].data_[1]) {
      for (uVar2 = (uint)(local_88 / in_RDI[0xa8].data_[0]);
          uVar2 < *(uint *)((long)in_RDI[2].data_ + 4); uVar2 = uVar2 + 1) {
        dVar4 = local_120;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI[0xa8].data_ + 1),
                            (ulong)uVar2);
        *pvVar3 = dVar4 + *pvVar3;
      }
    }
  }
  return;
}

Assistant:

void Kirkwood::collectHistogram(StuntDouble* sd1, StuntDouble* sd2) {
    if (sd1 == sd2) { return; }
    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    Vector3d pos1 = sd1->getPos();
    Vector3d pos2 = sd2->getPos();
    Vector3d r12  = pos2 - pos1;
    if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(r12);

    RealType distance = r12.length();

    AtomType* atype1 = static_cast<Atom*>(sd1)->getAtomType();
    AtomType* atype2 = static_cast<Atom*>(sd2)->getAtomType();

    MultipoleAdapter ma1 = MultipoleAdapter(atype1);
    MultipoleAdapter ma2 = MultipoleAdapter(atype2);

    Vector3d d1(0.0);
    Vector3d d2(0.0);
    RealType dotProduct(0.0);

    if (ma1.isDipole()) {
      d1 = sd1->getDipole();
      d1.normalize();
      if (ma2.isDipole()) {
        d2 = sd2->getDipole();
        d2.normalize();
        dotProduct = dot(d1, d2);
      }
    }

    if (distance < len_) {
      int whichBin = int(distance / deltaR_);
      // each dipole pair contributes to all of the radii that contain it.
      for (unsigned int i = whichBin; i < nBins_; i++) {
        histogram_[i] += dotProduct;
      }
    }
  }